

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wif.c
# Opt level: O0

int wally_wif_to_public_key(char *wif,uint32_t prefix,uchar *bytes_out,size_t len,size_t *written)

{
  int iVar1;
  uchar local_a8 [8];
  uchar pub_key [33];
  byte local_78;
  uchar auStack_77 [7];
  uchar buf [38];
  size_t local_48;
  size_t uncompressed;
  size_t *psStack_38;
  int ret;
  size_t *written_local;
  size_t len_local;
  uchar *bytes_out_local;
  char *pcStack_18;
  uint32_t prefix_local;
  char *wif_local;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if (((wif == (char *)0x0) || ((prefix & 0xffffff00) != 0)) || (bytes_out == (uchar *)0x0)) {
    wif_local._4_4_ = -2;
  }
  else {
    psStack_38 = written;
    written_local = (size_t *)len;
    len_local = (size_t)bytes_out;
    bytes_out_local._4_4_ = prefix;
    pcStack_18 = wif;
    uncompressed._4_4_ = is_uncompressed(wif,&local_78,0x26,&local_48);
    if ((local_78 == bytes_out_local._4_4_) && (uncompressed._4_4_ == 0)) {
      iVar1 = 0x21;
      if (local_48 != 0) {
        iVar1 = 0x41;
      }
      *psStack_38 = (long)iVar1;
      if (written_local < (size_t *)*psStack_38) {
        wally_clear(&local_78,0x26);
        wif_local._4_4_ = 0;
      }
      else {
        if (local_48 == 0) {
          uncompressed._4_4_ =
               wally_ec_public_key_from_private_key(auStack_77,0x20,(uchar *)len_local,0x21);
        }
        else {
          uncompressed._4_4_ = wally_ec_public_key_from_private_key(auStack_77,0x20,local_a8,0x21);
          if (uncompressed._4_4_ == 0) {
            uncompressed._4_4_ =
                 wally_ec_public_key_decompress(local_a8,0x21,(uchar *)len_local,0x41);
          }
        }
        if (uncompressed._4_4_ != 0) {
          *psStack_38 = 0;
        }
        wally_clear_2(&local_78,0x26,local_a8,0x21);
        wif_local._4_4_ = uncompressed._4_4_;
      }
    }
    else {
      wally_clear(&local_78,0x26);
      wif_local._4_4_ = -2;
    }
  }
  return wif_local._4_4_;
}

Assistant:

int wally_wif_to_public_key(const char *wif,
                            uint32_t prefix,
                            unsigned char *bytes_out,
                            size_t len,
                            size_t *written)
{
    int ret;
    size_t uncompressed;
    unsigned char buf[2 + EC_PRIVATE_KEY_LEN + BASE58_CHECKSUM_LEN], pub_key[EC_PUBLIC_KEY_LEN];

    if (written)
        *written = 0;

    if (!wif || (prefix & ~0xff) || !bytes_out)
        return WALLY_EINVAL;

    ret = is_uncompressed(wif, buf, sizeof(buf), &uncompressed);

    if (buf[0] != prefix || ret) {
        wally_clear(buf, sizeof(buf));
        return WALLY_EINVAL; /** Prefix does not match or invalid format*/
    }

    *written = uncompressed ? EC_PUBLIC_KEY_UNCOMPRESSED_LEN : EC_PUBLIC_KEY_LEN;

    if (len < *written) {
        wally_clear(buf, sizeof(buf));
        return WALLY_OK; /* Not enough output space, return required size */
    }

    if (uncompressed) {
        if (!(ret = wally_ec_public_key_from_private_key(&buf[1], EC_PRIVATE_KEY_LEN, pub_key, EC_PUBLIC_KEY_LEN)))
            ret = wally_ec_public_key_decompress(pub_key, EC_PUBLIC_KEY_LEN, bytes_out, EC_PUBLIC_KEY_UNCOMPRESSED_LEN);
    } else
        ret = wally_ec_public_key_from_private_key(&buf[1], EC_PRIVATE_KEY_LEN, bytes_out, EC_PUBLIC_KEY_LEN);

    if (ret != WALLY_OK)
        *written = 0;

    wally_clear_2(buf, sizeof(buf), pub_key, sizeof(pub_key));
    return ret;
}